

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RealSpaceTest.cpp
# Opt level: O1

void __thiscall RandomRealPointConstructor::test_method(RandomRealPointConstructor *this)

{
  undefined1 uVar1;
  undefined **local_2e0;
  char *local_2d8;
  undefined8 *local_2d0;
  char *local_2c8;
  undefined4 local_2bc;
  long local_2b8;
  undefined4 *local_2b0;
  undefined **local_2a8;
  ulong local_2a0;
  shared_count sStack_298;
  undefined4 **local_290;
  long *local_288;
  undefined1 local_280 [8];
  undefined8 local_278;
  shared_count asStack_270 [2];
  long local_260;
  char *local_250;
  char *local_248;
  undefined1 *local_240;
  undefined1 *local_238;
  char *local_230;
  char *local_228;
  undefined1 *local_220;
  undefined1 *local_218;
  char *local_210;
  char *local_208;
  undefined **local_200;
  undefined1 local_1f8;
  undefined8 *local_1f0;
  undefined ***local_1e8;
  char *local_1e0;
  char *local_1d8;
  RealSpace R3;
  void *local_178;
  void *local_168;
  Point y;
  void *local_150;
  ConstSubPoint local_140 [272];
  
  mnf::RealSpace::RealSpace(&R3,3);
  mnf::Manifold::createRandomPoint(1.0);
  local_210 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/RealSpaceTest.cpp"
  ;
  local_208 = "";
  local_220 = &boost::unit_test::basic_cstring<char_const>::null;
  local_218 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_210,0x42);
  local_2d8 = (char *)((ulong)local_2d8 & 0xffffffffffffff00);
  local_2e0 = &PTR__lazy_ostream_0012bb50;
  local_2d0 = &boost::unit_test::lazy_ostream::inst;
  local_2c8 = "";
  mnf::SubPoint::value();
  local_288 = &local_2b8;
  local_2b8 = local_260;
  local_280[0] = local_260 == 3;
  local_2b0 = &local_2bc;
  local_2bc = 3;
  local_278 = 0;
  asStack_270[0].pi_ = (sp_counted_base *)0x0;
  local_1e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/RealSpaceTest.cpp"
  ;
  local_1d8 = "";
  local_1e8 = (undefined ***)&local_288;
  local_1f8 = 0;
  local_200 = &PTR__lazy_ostream_0012bbc8;
  local_1f0 = &boost::unit_test::lazy_ostream::inst;
  local_290 = &local_2b0;
  local_2a0 = local_2a0 & 0xffffffffffffff00;
  local_2a8 = &PTR__lazy_ostream_0012bc08;
  sStack_298.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion
            (local_280,&local_2e0,&local_1e0,0x42,1,2,2,"y.value().size()",&local_200,"3",&local_2a8
            );
  boost::detail::shared_count::~shared_count(asStack_270);
  local_230 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/RealSpaceTest.cpp"
  ;
  local_228 = "";
  local_240 = &boost::unit_test::basic_cstring<char_const>::null;
  local_238 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_230,0x43);
  uVar1 = mnf::Point::isInM(1e-12);
  local_2a8 = (undefined **)CONCAT71(local_2a8._1_7_,uVar1);
  local_2a0 = 0;
  sStack_298.pi_ = (sp_counted_base *)0x0;
  local_2e0 = (undefined **)0x121416;
  local_2d8 = "";
  local_1f8 = 0;
  local_200 = &PTR__lazy_ostream_0012bc88;
  local_1f0 = &boost::unit_test::lazy_ostream::inst;
  local_1e8 = &local_2e0;
  local_250 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/RealSpaceTest.cpp"
  ;
  local_248 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_298);
  mnf::ConstSubPoint::~ConstSubPoint(local_140);
  free(local_150);
  _R3 = std::terminate;
  free(local_168);
  free(local_178);
  mnf::Manifold::~Manifold((Manifold *)&R3);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(RandomRealPointConstructor)
{
  RealSpace R3(3);
  Point y = R3.createRandomPoint();
  BOOST_CHECK_EQUAL(y.value().size(), 3);
  BOOST_CHECK(y.isInM());
}